

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

void __thiscall
google::protobuf::util::MessageDifferencer::set_field_comparator
          (MessageDifferencer *this,FieldComparator *comparator)

{
  LogMessage *pLVar1;
  LogMessage local_30;
  Voidify local_19;
  FieldComparator *local_18;
  FieldComparator *comparator_local;
  MessageDifferencer *this_local;
  
  if (comparator != (FieldComparator *)0x0) {
    this->field_comparator_kind_ = kFCBase;
    (this->field_comparator_).base = comparator;
    return;
  }
  local_18 = comparator;
  comparator_local = (FieldComparator *)this;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer.cc"
             ,0x140,"comparator");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [35])"Field comparator can\'t be nullptr.");
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

void MessageDifferencer::set_field_comparator(FieldComparator* comparator) {
  ABSL_CHECK(comparator) << "Field comparator can't be nullptr.";
  field_comparator_kind_ = kFCBase;
  field_comparator_.base = comparator;
}